

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNATrie.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  DNATrie *pDVar5;
  uint uVar6;
  bool bVar7;
  DNAChunk cnk;
  DNAChunk cnk3;
  DNAChunk cnk2;
  DNAChunk local_88;
  DNAChunk local_78;
  DNAChunk local_68;
  DNATrie local_58;
  
  if (argc == 2) {
    iVar3 = strcmp(argv[1],"test");
    if (iVar3 != 0) {
      return 0;
    }
  }
  else {
    main_cold_1();
  }
  DNAChunk::DNAChunk(&local_88,"AGCTT");
  local_58._count = 0xffffffffffffffff;
  local_58._root.count = 0;
  local_58._root.childNodes[0] = (DNANode *)0x0;
  local_58._root.childNodes[1] = (DNANode *)0x0;
  local_58._root.childNodes[2] = (DNANode *)0x0;
  DNANode::insert((DNANode *)&local_58,local_88.dna,local_88.dsize,false);
  lVar2 = local_58._root.count;
  lVar1 = *(long *)(local_58._root.count + 0x18);
  DNANode::~DNANode((DNANode *)&local_58);
  if (local_88.dna != (Base *)0x0) {
    operator_delete__(local_88.dna);
  }
  DNAChunk::DNAChunk(&local_88,"ACGTT");
  DNAChunk::DNAChunk(&local_68,"ACGTT");
  DNAChunk::DNAChunk(&local_78,"ACGTTAAA");
  local_58._count = 0xffffffffffffffff;
  local_58._root.count = 0;
  local_58._root.childNodes[0] = (DNANode *)0x0;
  local_58._root.childNodes[1] = (DNANode *)0x0;
  local_58._root.childNodes[2] = (DNANode *)0x0;
  DNANode::insert((DNANode *)&local_58,local_88.dna,local_88.dsize,false);
  DNANode::insert((DNANode *)&local_58,local_68.dna,local_68.dsize,false);
  DNANode::insert((DNANode *)&local_58,local_78.dna,local_78.dsize,false);
  lVar4 = DNANode::find((DNANode *)&local_58,local_88.dna,local_88.dsize);
  DNANode::~DNANode((DNANode *)&local_58);
  if (local_78.dna != (Base *)0x0) {
    operator_delete__(local_78.dna);
  }
  if (local_68.dna != (Base *)0x0) {
    operator_delete__(local_68.dna);
  }
  if (local_88.dna != (Base *)0x0) {
    operator_delete__(local_88.dna);
  }
  local_58._count = 0;
  local_58._root.count = -1;
  local_58._root.childNodes[0] = (DNANode *)0x0;
  local_58._root.childNodes[1] = (DNANode *)0x0;
  local_58._root.childNodes[2] = (DNANode *)0x0;
  local_58._root.childNodes[3] = (DNANode *)0x0;
  pDVar5 = DNATrie::operator<<(&local_58,"ACGGTT");
  pDVar5 = DNATrie::operator<<(pDVar5,"GCCTTTAA");
  DNATrie::operator<<(pDVar5,"AGGCC");
  bVar7 = local_58._count != 3;
  DNANode::~DNANode(&local_58._root);
  uVar6 = (uint)bVar7 + (uint)(lVar4 != 1) + (uint)(lVar2 == 0) + (uint)(lVar1 == 0);
  printf("Got %u failures\n",(ulong)uVar6);
  exit((uint)(uVar6 != 0) * 3);
}

Assistant:

int main(int argc, char const* argv[])
{
	if (argc != 2) {
		std::fprintf(stderr, "Must specify mode, got %d args\n", argc);
		std::exit(2);
	}
    if (std::strcmp(argv[1], "test") == 0) {
        gTester.clear();
        testDNANodeInsert();
        testDNANodeFind();
        testDNATrieLeftShift();
        gTester.finish();
    }
    return 0;
}